

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O2

void __thiscall fasttext::QuantMatrix::load(QuantMatrix *this,istream *in)

{
  ProductQuantizer *pPVar1;
  pointer __p;
  allocator_type local_39;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  std::istream::read((char *)in,(long)&this->qnorm_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).m_);
  std::istream::read((char *)in,(long)&(this->super_Matrix).n_);
  std::istream::read((char *)in,(long)&this->codesize_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
             (long)this->codesize_,&local_39);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&this->codes_,&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  std::istream::read((char *)in,
                     (long)(this->codes_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  pPVar1 = (ProductQuantizer *)operator_new(0x50);
  ProductQuantizer::ProductQuantizer(pPVar1);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  ::reset((__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           *)&this->pq_,pPVar1);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  ~unique_ptr((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               *)&local_38);
  ProductQuantizer::load
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,in);
  if (this->qnorm_ == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
               (this->super_Matrix).m_,&local_39);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&this->norm_codes_,&local_38);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
    std::istream::read((char *)in,
                       (long)(this->norm_codes_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    pPVar1 = (ProductQuantizer *)operator_new(0x50);
    ProductQuantizer::ProductQuantizer(pPVar1);
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    __uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    reset((__uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
           *)&this->npq_,pPVar1);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    ~unique_ptr((unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                 *)&local_38);
    ProductQuantizer::load
              ((this->npq_)._M_t.
               super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
               .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,in);
  }
  return;
}

Assistant:

void QuantMatrix::load(std::istream& in) {
  in.read((char*)&qnorm_, sizeof(qnorm_));
  in.read((char*)&m_, sizeof(m_));
  in.read((char*)&n_, sizeof(n_));
  in.read((char*)&codesize_, sizeof(codesize_));
  codes_ = std::vector<uint8_t>(codesize_);
  in.read((char*)codes_.data(), codesize_ * sizeof(uint8_t));
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
  pq_->load(in);
  if (qnorm_) {
    norm_codes_ = std::vector<uint8_t>(m_);
    in.read((char*)norm_codes_.data(), m_ * sizeof(uint8_t));
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer());
    npq_->load(in);
  }
}